

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<json_out_callbacks>::state>,_void>
* pstore::json::details::string_matcher<json_out_callbacks>::consume_hex_state
            (maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<json_out_callbacks>::state>,_void>
             *__return_storage_ptr__,uint hex,state state,char32_t code_point)

{
  maybe<unsigned_int,_void> local_28;
  anon_class_4_1_a8a4b3b1 local_20;
  char32_t local_1c;
  state local_18;
  char32_t code_point_local;
  state state_local;
  uint hex_local;
  
  local_20.state = state;
  local_1c = code_point;
  local_18 = state;
  code_point_local = hex;
  _state_local = __return_storage_ptr__;
  hex_value(&local_28,code_point,hex);
  operator>>=(__return_storage_ptr__,&local_28,local_20);
  maybe<unsigned_int,_void>::~maybe(&local_28);
  return __return_storage_ptr__;
}

Assistant:

auto string_matcher<Callbacks>::consume_hex_state (unsigned const hex,
                                                               enum state const state,
                                                               char32_t const code_point)
                -> maybe<std::tuple<unsigned, enum state>> {

                    return hex_value (code_point, hex) >>=
                           [state] (unsigned value) {
                               PSTORE_ASSERT (value <= std::numeric_limits<std::uint16_t>::max ());
                               auto next_state = state;
                               switch (state) {
                               case hex1_state: next_state = hex2_state; break;
                               case hex2_state: next_state = hex3_state; break;
                               case hex3_state: next_state = hex4_state; break;
                               case hex4_state: next_state = normal_char_state; break;

                               case start_state:
                               case normal_char_state:
                               case escape_state:
                               case done_state:
                                   PSTORE_ASSERT (false);
                                   return nothing<std::tuple<unsigned, enum state>> ();
                               }

                               return just (std::make_tuple (value, next_state));
                           };
                }